

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int ARKodeGetDky(void *arkode_mem,sunrealtype t,int k,N_Vector dky)

{
  long in_RDX;
  ARKodeMem in_RDI;
  ARKodeMem in_XMM0_Qa;
  ARKodeMem_conflict ark_mem_00;
  ARKInterp interp;
  double tau;
  ARKodeMem ark_mem;
  int retval;
  sunrealtype tn1;
  sunrealtype tp;
  sunrealtype tfuzz;
  sunrealtype s;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  uint local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x465,"ARKodeGetDky",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = 0xffffffeb;
  }
  else if (in_RDX == 0) {
    arkProcessError(in_RDI,-0x1a,0x46e,"ARKodeGetDky",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"dky = NULL illegal.");
    local_4 = 0xffffffe6;
  }
  else if (in_RDI->interp == (ARKInterp)0x0) {
    arkProcessError(in_RDI,-0x15,0x474,"ARKodeGetDky",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"Missing interpolation structure");
    local_4 = 0xffffffeb;
  }
  else {
    ark_mem_00 = (ARKodeMem_conflict)
                 (in_RDI->uround * 100.0 * (ABS(in_RDI->tcur) + ABS(in_RDI->hold)));
    if (in_RDI->hold <= 0.0 && in_RDI->hold != 0.0) {
      ark_mem_00 = (ARKodeMem_conflict)-(double)ark_mem_00;
    }
    interp = (ARKInterp)((in_RDI->tcur - in_RDI->hold) - (double)ark_mem_00);
    tau = in_RDI->tcur + (double)ark_mem_00;
    if (((double)in_XMM0_Qa - (double)interp) * ((double)in_XMM0_Qa - tau) <= 0.0) {
      local_4 = arkInterpEvaluate(ark_mem_00,interp,tau,in_stack_ffffffffffffffb4,
                                  in_stack_ffffffffffffffb0,(N_Vector)in_RDI);
      if (local_4 == 0) {
        local_4 = 0;
      }
      else {
        arkProcessError(in_RDI,(int)(ulong)local_4,0x48d,"ARKodeGetDky",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                        ,"Error calling arkInterpEvaluate");
      }
    }
    else {
      arkProcessError(in_XMM0_Qa,(int)(in_RDI->tcur - in_RDI->hold),(int)in_RDI->tcur,(char *)in_RDI
                      ,(char *)0xffffffe7,(char *)0x481,"ARKodeGetDky",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                      ,
                      "Illegal value for t. t = %lg is not between tcur - hold = %lg and tcur = %lg."
                     );
      local_4 = 0xffffffe7;
    }
  }
  return local_4;
}

Assistant:

int ARKodeGetDky(void* arkode_mem, sunrealtype t, int k, N_Vector dky)
{
  sunrealtype s, tfuzz, tp, tn1;
  int retval;
  ARKodeMem ark_mem;

  /* Check if ark_mem exists */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Check all inputs for legality */
  if (dky == NULL)
  {
    arkProcessError(ark_mem, ARK_BAD_DKY, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_DKY);
    return (ARK_BAD_DKY);
  }
  if (ark_mem->interp == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "Missing interpolation structure");
    return (ARK_MEM_NULL);
  }

  /* Allow for some slack */
  tfuzz = FUZZ_FACTOR * ark_mem->uround *
          (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->hold));
  if (ark_mem->hold < ZERO) { tfuzz = -tfuzz; }
  tp  = ark_mem->tcur - ark_mem->hold - tfuzz;
  tn1 = ark_mem->tcur + tfuzz;
  if ((t - tp) * (t - tn1) > ZERO)
  {
    arkProcessError(ark_mem, ARK_BAD_T, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_T, t, ark_mem->tcur - ark_mem->hold,
                    ark_mem->tcur);
    return (ARK_BAD_T);
  }

  /* call arkInterpEvaluate to evaluate result */
  s      = (t - ark_mem->tcur) / ark_mem->h;
  retval = arkInterpEvaluate(ark_mem, ark_mem->interp, s, k,
                             ARK_INTERP_MAX_DEGREE, dky);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Error calling arkInterpEvaluate");
    return (retval);
  }
  return (ARK_SUCCESS);
}